

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

int32 __thiscall Func::StackAllocate(Func *this,StackSym *stackSym,int size)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  int32 iVar4;
  undefined4 *puVar5;
  
  if (size < 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x2ce,"(size > 0)","size > 0");
    if (!bVar2) goto LAB_00409747;
    *puVar5 = 0;
  }
  bVar2 = StackSym::IsArgSlotSym(stackSym);
  if ((bVar2) || (uVar3 = *(uint *)&stackSym->field_0x18, (uVar3 & 0x401000) != 0)) {
    iVar4 = stackSym->m_offset;
  }
  else {
    if (stackSym->m_offset != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x2d3,"(stackSym->m_offset == 0)","stackSym->m_offset == 0");
      if (!bVar2) {
LAB_00409747:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
      uVar3 = *(uint *)&stackSym->field_0x18;
    }
    *(uint *)&stackSym->field_0x18 = uVar3 | 0x1000;
    iVar4 = StackAllocate(this,size);
    stackSym->m_offset = iVar4;
  }
  return iVar4;
}

Assistant:

int32
Func::StackAllocate(StackSym *stackSym, int size)
{
    Assert(size > 0);
    if (stackSym->IsArgSlotSym() || stackSym->IsParamSlotSym() || stackSym->IsAllocated())
    {
        return stackSym->m_offset;
    }
    Assert(stackSym->m_offset == 0);
    stackSym->m_allocated = true;
    stackSym->m_offset = StackAllocate(size);

    return stackSym->m_offset;
}